

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::RegridOnly(Amr *this,Real time,bool do_io)

{
  int *piVar1;
  byte in_SIL;
  Amr *in_RDI;
  undefined8 in_XMM0_Qa;
  int i;
  int lev_top;
  uint local_20;
  int local_1c;
  int local_18;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_SIL & 1;
  if ((in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level == 0) {
    (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])();
  }
  else {
    local_1c = (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + -1;
    local_10 = in_XMM0_Qa;
    piVar1 = std::min<int>((int *)&(in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                           &local_1c);
    local_18 = *piVar1;
    for (local_20 = 0; (int)local_20 <= local_18; local_20 = local_20 + 1) {
      (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(local_10,in_RDI,(ulong)local_20,0);
    }
  }
  if ((local_11 & 1) != 0) {
    if ((anonymous_namespace)::plotfile_on_restart != 0) {
      (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])();
    }
    if ((anonymous_namespace)::checkpoint_on_restart != 0) {
      (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])();
    }
    if ((anonymous_namespace)::insitu_on_restart != 0) {
      updateInSitu(in_RDI);
    }
  }
  return;
}

Assistant:

void
Amr::RegridOnly (Real time, bool do_io)
{
    BL_ASSERT(regrid_on_restart == 1);

    if (max_level == 0)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i = 0; i <= lev_top; i++)
        {
           regrid(i,time);
        }
    }

    if (do_io) {

        if (plotfile_on_restart)
            writePlotFile();

        if (checkpoint_on_restart)
            checkPoint();

        if (insitu_on_restart)
            updateInSitu();

    }
}